

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

uint8 * __thiscall
google::protobuf::DescriptorProto::InternalSerializeWithCachedSizesToArray
          (DescriptorProto *this,uint8 *target,EpsCopyOutputStream *stream)

{
  int iVar1;
  FieldDescriptorProto *pFVar2;
  DescriptorProto *this_00;
  EnumDescriptorProto *this_01;
  DescriptorProto_ExtensionRange *this_02;
  MessageOptions *this_03;
  OneofDescriptorProto *this_04;
  DescriptorProto_ReservedRange *this_05;
  string *s;
  size_t __n;
  void *pvVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  uint8 *puVar11;
  uint8 *puVar12;
  
  uVar6 = (this->_has_bits_).has_bits_[0];
  if ((uVar6 & 1) != 0) {
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,1,(this->name_).ptr_,target);
  }
  iVar1 = (this->field_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar1 != 0) {
    iVar9 = 0;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      pFVar2 = (FieldDescriptorProto *)
               ((this->field_).super_RepeatedPtrFieldBase.rep_)->elements[iVar9];
      *target = '\x12';
      uVar7 = (pFVar2->_cached_size_).size_.super___atomic_base<int>._M_i;
      if (uVar7 < 0x80) {
        target[1] = (byte)uVar7;
        puVar11 = target + 2;
      }
      else {
        target[1] = (byte)uVar7 | 0x80;
        if (uVar7 < 0x4000) {
          target[2] = (uint8)(uVar7 >> 7);
          puVar11 = target + 3;
        }
        else {
          puVar11 = target + 3;
          uVar7 = uVar7 >> 7;
          do {
            puVar12 = puVar11;
            puVar12[-1] = (byte)uVar7 | 0x80;
            uVar5 = uVar7 >> 7;
            puVar11 = puVar12 + 1;
            bVar4 = 0x3fff < uVar7;
            uVar7 = uVar5;
          } while (bVar4);
          *puVar12 = (uint8)uVar5;
        }
      }
      target = FieldDescriptorProto::InternalSerializeWithCachedSizesToArray(pFVar2,puVar11,stream);
      iVar9 = iVar9 + 1;
    } while (iVar9 != iVar1);
  }
  iVar1 = (this->nested_type_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar1 != 0) {
    iVar9 = 0;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      this_00 = (DescriptorProto *)
                ((this->nested_type_).super_RepeatedPtrFieldBase.rep_)->elements[iVar9];
      *target = '\x1a';
      uVar7 = (this_00->_cached_size_).size_.super___atomic_base<int>._M_i;
      if (uVar7 < 0x80) {
        target[1] = (byte)uVar7;
        puVar11 = target + 2;
      }
      else {
        target[1] = (byte)uVar7 | 0x80;
        if (uVar7 < 0x4000) {
          target[2] = (uint8)(uVar7 >> 7);
          puVar11 = target + 3;
        }
        else {
          puVar11 = target + 3;
          uVar7 = uVar7 >> 7;
          do {
            puVar12 = puVar11;
            puVar12[-1] = (byte)uVar7 | 0x80;
            uVar5 = uVar7 >> 7;
            puVar11 = puVar12 + 1;
            bVar4 = 0x3fff < uVar7;
            uVar7 = uVar5;
          } while (bVar4);
          *puVar12 = (uint8)uVar5;
        }
      }
      target = InternalSerializeWithCachedSizesToArray(this_00,puVar11,stream);
      iVar9 = iVar9 + 1;
    } while (iVar9 != iVar1);
  }
  iVar1 = (this->enum_type_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar1 != 0) {
    iVar9 = 0;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      this_01 = (EnumDescriptorProto *)
                ((this->enum_type_).super_RepeatedPtrFieldBase.rep_)->elements[iVar9];
      *target = '\"';
      uVar7 = (this_01->_cached_size_).size_.super___atomic_base<int>._M_i;
      if (uVar7 < 0x80) {
        target[1] = (byte)uVar7;
        puVar11 = target + 2;
      }
      else {
        target[1] = (byte)uVar7 | 0x80;
        if (uVar7 < 0x4000) {
          target[2] = (uint8)(uVar7 >> 7);
          puVar11 = target + 3;
        }
        else {
          puVar11 = target + 3;
          uVar7 = uVar7 >> 7;
          do {
            puVar12 = puVar11;
            puVar12[-1] = (byte)uVar7 | 0x80;
            uVar5 = uVar7 >> 7;
            puVar11 = puVar12 + 1;
            bVar4 = 0x3fff < uVar7;
            uVar7 = uVar5;
          } while (bVar4);
          *puVar12 = (uint8)uVar5;
        }
      }
      target = EnumDescriptorProto::InternalSerializeWithCachedSizesToArray(this_01,puVar11,stream);
      iVar9 = iVar9 + 1;
    } while (iVar9 != iVar1);
  }
  iVar1 = (this->extension_range_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar1 != 0) {
    iVar9 = 0;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      this_02 = (DescriptorProto_ExtensionRange *)
                ((this->extension_range_).super_RepeatedPtrFieldBase.rep_)->elements[iVar9];
      *target = '*';
      uVar7 = (this_02->_cached_size_).size_.super___atomic_base<int>._M_i;
      if (uVar7 < 0x80) {
        target[1] = (byte)uVar7;
        puVar11 = target + 2;
      }
      else {
        target[1] = (byte)uVar7 | 0x80;
        if (uVar7 < 0x4000) {
          target[2] = (uint8)(uVar7 >> 7);
          puVar11 = target + 3;
        }
        else {
          puVar11 = target + 3;
          uVar7 = uVar7 >> 7;
          do {
            puVar12 = puVar11;
            puVar12[-1] = (byte)uVar7 | 0x80;
            uVar5 = uVar7 >> 7;
            puVar11 = puVar12 + 1;
            bVar4 = 0x3fff < uVar7;
            uVar7 = uVar5;
          } while (bVar4);
          *puVar12 = (uint8)uVar5;
        }
      }
      target = DescriptorProto_ExtensionRange::InternalSerializeWithCachedSizesToArray
                         (this_02,puVar11,stream);
      iVar9 = iVar9 + 1;
    } while (iVar9 != iVar1);
  }
  iVar1 = (this->extension_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar1 != 0) {
    iVar9 = 0;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      pFVar2 = (FieldDescriptorProto *)
               ((this->extension_).super_RepeatedPtrFieldBase.rep_)->elements[iVar9];
      *target = '2';
      uVar7 = (pFVar2->_cached_size_).size_.super___atomic_base<int>._M_i;
      if (uVar7 < 0x80) {
        target[1] = (byte)uVar7;
        puVar11 = target + 2;
      }
      else {
        target[1] = (byte)uVar7 | 0x80;
        if (uVar7 < 0x4000) {
          target[2] = (uint8)(uVar7 >> 7);
          puVar11 = target + 3;
        }
        else {
          puVar11 = target + 3;
          uVar7 = uVar7 >> 7;
          do {
            puVar12 = puVar11;
            puVar12[-1] = (byte)uVar7 | 0x80;
            uVar5 = uVar7 >> 7;
            puVar11 = puVar12 + 1;
            bVar4 = 0x3fff < uVar7;
            uVar7 = uVar5;
          } while (bVar4);
          *puVar12 = (uint8)uVar5;
        }
      }
      target = FieldDescriptorProto::InternalSerializeWithCachedSizesToArray(pFVar2,puVar11,stream);
      iVar9 = iVar9 + 1;
    } while (iVar9 != iVar1);
  }
  if ((uVar6 & 2) != 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    this_03 = this->options_;
    *target = ':';
    uVar6 = (this_03->_cached_size_).size_.super___atomic_base<int>._M_i;
    if (uVar6 < 0x80) {
      target[1] = (byte)uVar6;
      puVar11 = target + 2;
    }
    else {
      target[1] = (byte)uVar6 | 0x80;
      if (uVar6 < 0x4000) {
        target[2] = (uint8)(uVar6 >> 7);
        puVar11 = target + 3;
      }
      else {
        puVar11 = target + 3;
        uVar6 = uVar6 >> 7;
        do {
          puVar12 = puVar11;
          puVar12[-1] = (byte)uVar6 | 0x80;
          uVar7 = uVar6 >> 7;
          puVar11 = puVar12 + 1;
          bVar4 = 0x3fff < uVar6;
          uVar6 = uVar7;
        } while (bVar4);
        *puVar12 = (uint8)uVar7;
      }
    }
    target = MessageOptions::InternalSerializeWithCachedSizesToArray(this_03,puVar11,stream);
  }
  iVar1 = (this->oneof_decl_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar1 != 0) {
    iVar9 = 0;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      this_04 = (OneofDescriptorProto *)
                ((this->oneof_decl_).super_RepeatedPtrFieldBase.rep_)->elements[iVar9];
      *target = 'B';
      uVar6 = (this_04->_cached_size_).size_.super___atomic_base<int>._M_i;
      if (uVar6 < 0x80) {
        target[1] = (byte)uVar6;
        puVar11 = target + 2;
      }
      else {
        target[1] = (byte)uVar6 | 0x80;
        if (uVar6 < 0x4000) {
          target[2] = (uint8)(uVar6 >> 7);
          puVar11 = target + 3;
        }
        else {
          puVar11 = target + 3;
          uVar6 = uVar6 >> 7;
          do {
            puVar12 = puVar11;
            puVar12[-1] = (byte)uVar6 | 0x80;
            uVar7 = uVar6 >> 7;
            puVar11 = puVar12 + 1;
            bVar4 = 0x3fff < uVar6;
            uVar6 = uVar7;
          } while (bVar4);
          *puVar12 = (uint8)uVar7;
        }
      }
      target = OneofDescriptorProto::InternalSerializeWithCachedSizesToArray(this_04,puVar11,stream)
      ;
      iVar9 = iVar9 + 1;
    } while (iVar9 != iVar1);
  }
  iVar1 = (this->reserved_range_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar1 != 0) {
    iVar9 = 0;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      this_05 = (DescriptorProto_ReservedRange *)
                ((this->reserved_range_).super_RepeatedPtrFieldBase.rep_)->elements[iVar9];
      *target = 'J';
      uVar6 = (this_05->_cached_size_).size_.super___atomic_base<int>._M_i;
      if (uVar6 < 0x80) {
        target[1] = (byte)uVar6;
        puVar11 = target + 2;
      }
      else {
        target[1] = (byte)uVar6 | 0x80;
        if (uVar6 < 0x4000) {
          target[2] = (uint8)(uVar6 >> 7);
          puVar11 = target + 3;
        }
        else {
          puVar11 = target + 3;
          uVar6 = uVar6 >> 7;
          do {
            puVar12 = puVar11;
            puVar12[-1] = (byte)uVar6 | 0x80;
            uVar7 = uVar6 >> 7;
            puVar11 = puVar12 + 1;
            bVar4 = 0x3fff < uVar6;
            uVar6 = uVar7;
          } while (bVar4);
          *puVar12 = (uint8)uVar7;
        }
      }
      target = DescriptorProto_ReservedRange::InternalSerializeWithCachedSizesToArray
                         (this_05,puVar11,stream);
      iVar9 = iVar9 + 1;
    } while (iVar9 != iVar1);
  }
  lVar10 = (long)(this->reserved_name_).super_RepeatedPtrFieldBase.current_size_;
  if (0 < lVar10) {
    lVar8 = 0;
    do {
      s = (string *)((this->reserved_name_).super_RepeatedPtrFieldBase.rep_)->elements[lVar8];
      __n = s->_M_string_length;
      if (((long)__n < 0x80) && ((long)__n <= (long)(stream->end_ + (0xe - (long)target)))) {
        *target = 'R';
        target[1] = (uint8)__n;
        memcpy(target + 2,(s->_M_dataplus)._M_p,__n);
        target = target + __n + 2;
      }
      else {
        target = io::EpsCopyOutputStream::WriteStringOutline(stream,10,s,target);
      }
      lVar8 = lVar8 + 1;
    } while (lVar10 != lVar8);
  }
  pvVar3 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar3 & 1) != 0) {
    puVar11 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                        ((UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe),target,stream);
    return puVar11;
  }
  return target;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* DescriptorProto::InternalSerializeWithCachedSizesToArray(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.DescriptorProto)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string name = 1;
  if (cached_has_bits & 0x00000001u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_name().data(), static_cast<int>(this->_internal_name().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.DescriptorProto.name");
    target = stream->WriteStringMaybeAliased(
        1, this->_internal_name(), target);
  }

  // repeated .google.protobuf.FieldDescriptorProto field = 2;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_field_size()); i < n; i++) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(2, this->_internal_field(i), target, stream);
  }

  // repeated .google.protobuf.DescriptorProto nested_type = 3;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_nested_type_size()); i < n; i++) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(3, this->_internal_nested_type(i), target, stream);
  }

  // repeated .google.protobuf.EnumDescriptorProto enum_type = 4;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_enum_type_size()); i < n; i++) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(4, this->_internal_enum_type(i), target, stream);
  }

  // repeated .google.protobuf.DescriptorProto.ExtensionRange extension_range = 5;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_extension_range_size()); i < n; i++) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(5, this->_internal_extension_range(i), target, stream);
  }

  // repeated .google.protobuf.FieldDescriptorProto extension = 6;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_extension_size()); i < n; i++) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(6, this->_internal_extension(i), target, stream);
  }

  // optional .google.protobuf.MessageOptions options = 7;
  if (cached_has_bits & 0x00000002u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(
        7, _Internal::options(this), target, stream);
  }

  // repeated .google.protobuf.OneofDescriptorProto oneof_decl = 8;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_oneof_decl_size()); i < n; i++) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(8, this->_internal_oneof_decl(i), target, stream);
  }

  // repeated .google.protobuf.DescriptorProto.ReservedRange reserved_range = 9;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_reserved_range_size()); i < n; i++) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(9, this->_internal_reserved_range(i), target, stream);
  }

  // repeated string reserved_name = 10;
  for (int i = 0, n = this->_internal_reserved_name_size(); i < n; i++) {
    const auto& s = this->_internal_reserved_name(i);
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      s.data(), static_cast<int>(s.length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.DescriptorProto.reserved_name");
    target = stream->WriteString(10, s, target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields(), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.DescriptorProto)
  return target;
}